

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O0

void spvtools::opt::anon_unknown_21::GetDependences
               (vector<spvtools::opt::DistanceVector,_std::allocator<spvtools::opt::DistanceVector>_>
                *dependences,LoopDependenceAnalysis *analysis,
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               *sources,vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        *destinations,size_t num_entries)

{
  Instruction *source_00;
  bool bVar1;
  reference ppIVar2;
  undefined1 local_88 [8];
  DistanceVector dist;
  Instruction *destination;
  const_iterator __end3;
  const_iterator __begin3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3;
  Instruction *source;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  size_t num_entries_local;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *destinations_local;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *sources_local
  ;
  LoopDependenceAnalysis *analysis_local;
  vector<spvtools::opt::DistanceVector,_std::allocator<spvtools::opt::DistanceVector>_>
  *dependences_local;
  
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin(sources);
  source = (Instruction *)
           std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end(sources);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                *)&source);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    source_00 = *ppIVar2;
    __end3 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin(destinations);
    destination = (Instruction *)
                  std::
                  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ::end(destinations);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                  *)&destination);
      if (!bVar1) break;
      ppIVar2 = __gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end3);
      dist.entries.
      super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppIVar2;
      DistanceVector::DistanceVector((DistanceVector *)local_88,num_entries);
      bVar1 = LoopDependenceAnalysis::GetDependence
                        (analysis,source_00,
                         (Instruction *)
                         dist.entries.
                         super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (DistanceVector *)local_88);
      if (!bVar1) {
        std::vector<spvtools::opt::DistanceVector,_std::allocator<spvtools::opt::DistanceVector>_>::
        push_back(dependences,(value_type *)local_88);
      }
      DistanceVector::~DistanceVector((DistanceVector *)local_88);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void GetDependences(std::vector<DistanceVector>* dependences,
                    LoopDependenceAnalysis* analysis,
                    const std::vector<Instruction*>& sources,
                    const std::vector<Instruction*>& destinations,
                    size_t num_entries) {
  for (auto source : sources) {
    for (auto destination : destinations) {
      DistanceVector dist(num_entries);
      if (!analysis->GetDependence(source, destination, &dist)) {
        dependences->push_back(dist);
      }
    }
  }
}